

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2NodeTransformBlock(Parser *this,BaseNode *mesh)

{
  bool bVar1;
  __type _Var2;
  Logger *pLVar3;
  float *pfVar4;
  aiVector3D *local_118;
  __type local_e9;
  uint local_d0;
  uint local_cc;
  uint i_2;
  uint aiVal_2 [3];
  uint i_1;
  uint aiVal_1 [3];
  uint i;
  uint aiVal [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  size_type s;
  undefined1 local_40 [8];
  string temp;
  int mode;
  int iDepth;
  BaseNode *mesh_local;
  Parser *this_local;
  
  temp.field_2._12_4_ = 0;
  temp.field_2._8_4_ = 0;
LAB_0062e56c:
  if (*this->filePtr == '*') {
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_40);
      bVar1 = ParseString(this,(string *)local_40,"*NODE_NAME");
      if (!bVar1) {
        SkipToNextToken(this);
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,&mesh->mName);
      if (_Var2) {
        temp.field_2._8_4_ = 1;
      }
      else {
        local_58 = std::__cxx11::string::find(local_40,0xbb38dd);
        local_e9 = false;
        if (local_58 != -1) {
          std::__cxx11::string::substr((ulong)&local_78,(ulong)local_40);
          local_e9 = std::operator==(&mesh->mName,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        if (local_e9 == false) {
          pLVar3 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (aiVal + 1),"ASE: Unknown node transformation: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          Logger::error(pLVar3,(string *)(aiVal + 1));
          std::__cxx11::string::~string((string *)(aiVal + 1));
        }
        else if (((mesh->mType == Light) && (*(int *)&mesh->field_0x154 == 1)) ||
                ((mesh->mType == Camera && (*(int *)&mesh[1].mName == 1)))) {
          temp.field_2._8_4_ = 2;
        }
        else {
          pLVar3 = DefaultLogger::get();
          Logger::error(pLVar3,
                        "ASE: Ignoring target transform, this is no spot light or target camera");
        }
      }
      std::__cxx11::string::~string((string *)local_40);
      goto LAB_0062e56c;
    }
    if (temp.field_2._8_4_ != 0) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"TM_ROW3",7);
      if (bVar1) {
        if (temp.field_2._8_4_ == 1) {
          local_118 = (aiVector3D *)aiMatrix4x4t<float>::operator[](&mesh->mTransform,3);
        }
        else {
          local_118 = &mesh->mTargetPosition;
        }
        ParseLV4MeshFloatTriple(this,&local_118->x);
        goto LAB_0062e56c;
      }
      if (temp.field_2._8_4_ != 1) goto LAB_0062ea75;
      bVar1 = TokenMatch<char_const>(&this->filePtr,"TM_ROW0",7);
      if (bVar1) {
        pfVar4 = aiMatrix4x4t<float>::operator[](&mesh->mTransform,0);
        ParseLV4MeshFloatTriple(this,pfVar4);
        goto LAB_0062e56c;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"TM_ROW1",7);
      if (bVar1) {
        pfVar4 = aiMatrix4x4t<float>::operator[](&mesh->mTransform,1);
        ParseLV4MeshFloatTriple(this,pfVar4);
        goto LAB_0062e56c;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"TM_ROW2",7);
      if (bVar1) {
        pfVar4 = aiMatrix4x4t<float>::operator[](&mesh->mTransform,2);
        ParseLV4MeshFloatTriple(this,pfVar4);
        goto LAB_0062e56c;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"INHERIT_POS",0xb);
      if (bVar1) {
        ParseLV4MeshLongTriple(this,aiVal_1 + 2);
        for (aiVal_1[1] = 0; aiVal_1[1] < 3; aiVal_1[1] = aiVal_1[1] + 1) {
          (mesh->inherit).abInheritPosition[aiVal_1[1]] = aiVal_1[(ulong)aiVal_1[1] + 2] != 0;
        }
        goto LAB_0062e56c;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"INHERIT_ROT",0xb);
      if (bVar1) {
        ParseLV4MeshLongTriple(this,aiVal_2 + 2);
        for (aiVal_2[1] = 0; aiVal_2[1] < 3; aiVal_2[1] = aiVal_2[1] + 1) {
          (mesh->inherit).abInheritRotation[aiVal_2[1]] = aiVal_2[(ulong)aiVal_2[1] + 2] != 0;
        }
        goto LAB_0062e56c;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"INHERIT_SCL",0xb);
      if (bVar1) {
        ParseLV4MeshLongTriple(this,&local_cc);
        for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
          (mesh->inherit).abInheritScaling[local_d0] = (&local_cc)[local_d0] != 0;
        }
        goto LAB_0062e56c;
      }
    }
  }
LAB_0062ea75:
  if (*this->filePtr == '{') {
    temp.field_2._12_4_ = temp.field_2._12_4_ + 1;
  }
  else if (*this->filePtr == '}') {
    temp.field_2._12_4_ = temp.field_2._12_4_ + -1;
    if (temp.field_2._12_4_ == 0) {
      this->filePtr = this->filePtr + 1;
      SkipToNextToken(this);
      return;
    }
  }
  else if (*this->filePtr == '\0') {
    LogError(this,"Encountered unexpected EOL while parsing a *NODE_TM chunk (Level 2)");
  }
  bVar1 = IsLineEnd<char>(*this->filePtr);
  if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = this->filePtr + 1;
  goto LAB_0062e56c;
}

Assistant:

void Parser::ParseLV2NodeTransformBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();
    int mode   = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // name of the node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                std::string::size_type s;
                if (temp == mesh.mName)
                {
                    mode = 1;
                }
                else if (std::string::npos != (s = temp.find(".Target")) &&
                    mesh.mName == temp.substr(0,s))
                {
                    // This should be either a target light or a target camera
                    if ( (mesh.mType == BaseNode::Light &&  ((ASE::Light&)mesh) .mLightType  == ASE::Light::TARGET) ||
                         (mesh.mType == BaseNode::Camera && ((ASE::Camera&)mesh).mCameraType == ASE::Camera::TARGET))
                    {
                        mode = 2;
                    }
                    else {
                        ASSIMP_LOG_ERROR("ASE: Ignoring target transform, "
                            "this is no spot light or target camera");
                    }
                }
                else
                {
                    ASSIMP_LOG_ERROR("ASE: Unknown node transformation: " + temp);
                    // mode = 0
                }
                continue;
            }
            if (mode)
            {
                // fourth row of the transformation matrix - and also the
                // only information here that is interesting for targets
                if (TokenMatch(filePtr,"TM_ROW3" ,7))
                {
                    ParseLV4MeshFloatTriple((mode == 1 ? mesh.mTransform[3] : &mesh.mTargetPosition.x));
                    continue;
                }
                if (mode == 1)
                {
                    // first row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW0" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[0]);
                        continue;
                    }
                    // second row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW1" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[1]);
                        continue;
                    }
                    // third row of the transformation matrix
                    if (TokenMatch(filePtr,"TM_ROW2" ,7))
                    {
                        ParseLV4MeshFloatTriple(mesh.mTransform[2]);
                        continue;
                    }
                    // inherited position axes
                    if (TokenMatch(filePtr,"INHERIT_POS" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritPosition[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited rotation axes
                    if (TokenMatch(filePtr,"INHERIT_ROT" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritRotation[i] = aiVal[i] != 0;
                        continue;
                    }
                    // inherited scaling axes
                    if (TokenMatch(filePtr,"INHERIT_SCL" ,11))
                    {
                        unsigned int aiVal[3];
                        ParseLV4MeshLongTriple(aiVal);

                        for (unsigned int i = 0; i < 3;++i)
                            mesh.inherit.abInheritScaling[i] = aiVal[i] != 0;
                        continue;
                    }
                }
            }
        }
        AI_ASE_HANDLE_SECTION("2","*NODE_TM");
    }
    return;
}